

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_wstring_with_real(void)

{
  undefined1 local_a89;
  basic_variable<std::allocator<char>_> local_a88;
  basic_variable<std::allocator<char>_> local_a58;
  undefined1 local_a1b [2];
  undefined1 local_a19;
  basic_variable<std::allocator<char>_> local_a18;
  basic_variable<std::allocator<char>_> local_9e8;
  undefined1 local_9ab [2];
  undefined1 local_9a9;
  basic_variable<std::allocator<char>_> local_9a8;
  basic_variable<std::allocator<char>_> local_978;
  undefined1 local_93b [2];
  undefined1 local_939;
  basic_variable<std::allocator<char>_> local_938;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8cb [2];
  undefined1 local_8c9;
  basic_variable<std::allocator<char>_> local_8c8;
  basic_variable<std::allocator<char>_> local_898;
  undefined1 local_85b [2];
  undefined1 local_859;
  basic_variable<std::allocator<char>_> local_858;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7eb [2];
  undefined1 local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  basic_variable<std::allocator<char>_> local_7b8;
  undefined1 local_77b [2];
  undefined1 local_779;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  undefined1 local_70b [2];
  undefined1 local_709;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62b [2];
  undefined1 local_629;
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  undefined1 local_5bb [2];
  undefined1 local_5b9;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_54b [2];
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_38b [2];
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_78,0.0);
  local_a[0] = trial::dynamic::operator<(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(0.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c8a,"void relational_suite::compare_wstring_with_real()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_e8,0.0);
  local_87[0] = trial::dynamic::operator<=(&local_b8,&local_e8);
  local_e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(0.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c8b,"void relational_suite::compare_wstring_with_real()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_158,0.0);
  local_eb[0] = trial::dynamic::operator>(&local_128,&local_158);
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(0.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c8c,"void relational_suite::compare_wstring_with_real()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_1c8,0.0);
  local_15b[0] = trial::dynamic::operator>=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(0.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c8d,"void relational_suite::compare_wstring_with_real()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_238,1.0);
  local_1cb[0] = trial::dynamic::operator<(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(1.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c8f,"void relational_suite::compare_wstring_with_real()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_2a8,1.0);
  local_23b[0] = trial::dynamic::operator<=(&local_278,&local_2a8);
  local_2a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(1.0f)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c90,"void relational_suite::compare_wstring_with_real()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_318,1.0);
  local_2ab[0] = trial::dynamic::operator>(&local_2e8,&local_318);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(1.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c91,"void relational_suite::compare_wstring_with_real()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>(&local_388,1.0);
  local_31b[0] = trial::dynamic::operator>=(&local_358,&local_388);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(1.0f)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c92,"void relational_suite::compare_wstring_with_real()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_3f8,0.0);
  local_38b[0] = trial::dynamic::operator<(&local_3c8,&local_3f8);
  local_3f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(0.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c96,"void relational_suite::compare_wstring_with_real()",local_38b,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_468,0.0);
  local_3fb[0] = trial::dynamic::operator<=(&local_438,&local_468);
  local_469 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(0.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c97,"void relational_suite::compare_wstring_with_real()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4a8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_4d8,0.0);
  local_46b[0] = trial::dynamic::operator>(&local_4a8,&local_4d8);
  local_4d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(0.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c98,"void relational_suite::compare_wstring_with_real()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_548,0.0);
  local_4db[0] = trial::dynamic::operator>=(&local_518,&local_548);
  local_549 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(0.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c99,"void relational_suite::compare_wstring_with_real()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_588,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_5b8,1.0);
  local_54b[0] = trial::dynamic::operator<(&local_588,&local_5b8);
  local_5b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(1.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c9b,"void relational_suite::compare_wstring_with_real()",local_54b,&local_5b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5f8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_628,1.0);
  local_5bb[0] = trial::dynamic::operator<=(&local_5f8,&local_628);
  local_629 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(1.0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c9c,"void relational_suite::compare_wstring_with_real()",local_5bb,&local_629);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_668,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_698,1.0);
  local_62b[0] = trial::dynamic::operator>(&local_668,&local_698);
  local_699 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(1.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c9d,"void relational_suite::compare_wstring_with_real()",local_62b,&local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_708,1.0);
  local_69b[0] = trial::dynamic::operator>=(&local_6d8,&local_708);
  local_709 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(1.0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1c9e,"void relational_suite::compare_wstring_with_real()",local_69b,&local_709);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_748,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_778,(longdouble)0);
  local_70b[0] = trial::dynamic::operator<(&local_748,&local_778);
  local_779 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(0.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca2,"void relational_suite::compare_wstring_with_real()",local_70b,&local_779);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_778);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_748);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7b8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_7e8,(longdouble)0);
  local_77b[0] = trial::dynamic::operator<=(&local_7b8,&local_7e8);
  local_7e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(0.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca3,"void relational_suite::compare_wstring_with_real()",local_77b,&local_7e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_828,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_858,(longdouble)0);
  local_7eb[0] = trial::dynamic::operator>(&local_828,&local_858);
  local_859 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(0.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca4,"void relational_suite::compare_wstring_with_real()",local_7eb,&local_859);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_898,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_8c8,(longdouble)0);
  local_85b[0] = trial::dynamic::operator>=(&local_898,&local_8c8);
  local_8c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(0.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca5,"void relational_suite::compare_wstring_with_real()",local_85b,&local_8c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_898);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_908,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_938,(longdouble)1);
  local_8cb[0] = trial::dynamic::operator<(&local_908,&local_938);
  local_939 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") < variable(1.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca7,"void relational_suite::compare_wstring_with_real()",local_8cb,&local_939);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_938);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_978,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_9a8,(longdouble)1);
  local_93b[0] = trial::dynamic::operator<=(&local_978,&local_9a8);
  local_9a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") <= variable(1.0L)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca8,"void relational_suite::compare_wstring_with_real()",local_93b,&local_9a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_978);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_9e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_a18,(longdouble)1);
  local_9ab[0] = trial::dynamic::operator>(&local_9e8,&local_a18);
  local_a19 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") > variable(1.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ca9,"void relational_suite::compare_wstring_with_real()",local_9ab,&local_a19);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a18);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a58,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<long_double>
            (&local_a88,(longdouble)1);
  local_a1b[0] = trial::dynamic::operator>=(&local_a58,&local_a88);
  local_a89 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") >= variable(1.0L)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1caa,"void relational_suite::compare_wstring_with_real()",local_a1b,&local_a89);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a88);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a58);
  return;
}

Assistant:

void compare_wstring_with_real()
{
    // wstring - float
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(0.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(0.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(0.0f), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(0.0f), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(1.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(1.0f), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(1.0f), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(1.0f), true);
    }
    // wstring - double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(0.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(0.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(0.0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(0.0), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(1.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(1.0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(1.0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(1.0), true);
    }
    // wstring - long double
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(0.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(0.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(0.0L), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(0.0L), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") < variable(1.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") <= variable(1.0L), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") > variable(1.0L), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") >= variable(1.0L), true);
    }
}